

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O2

real_t tinyobj::parseReal(char **token,double default_value)

{
  char *pcVar1;
  char cVar2;
  uint uVar3;
  size_t sVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  char *pcVar9;
  char *pcVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double local_38;
  
  pcVar10 = *token;
  sVar4 = strspn(pcVar10," \t");
  pcVar10 = pcVar10 + sVar4;
  *token = pcVar10;
  sVar4 = strcspn(pcVar10," \t\r");
  pcVar1 = pcVar10 + sVar4;
  local_38 = default_value;
  if ((long)sVar4 < 1) goto LAB_0011f5d2;
  cVar2 = *pcVar10;
  if ((cVar2 == '-') || (cVar2 == '+')) {
    pcVar10 = pcVar10 + 1;
    dVar13 = *(double *)(&DAT_00169f60 + (ulong)(cVar2 == '+') * 8);
  }
  else {
    if (9 < (int)cVar2 - 0x30U) goto LAB_0011f5d2;
    dVar13 = 1.0;
  }
  iVar5 = 0;
  dVar14 = 0.0;
  for (pcVar9 = pcVar10; pcVar9 != pcVar1; pcVar9 = pcVar9 + 1) {
    cVar2 = *pcVar9;
    uVar3 = (uint)cVar2;
    if (9 < uVar3 - 0x30) {
      if (iVar5 == 0) goto LAB_0011f5d2;
      pcVar10 = pcVar9;
      if ((cVar2 == 'e') || (cVar2 == 'E')) goto LAB_0011f518;
      if (cVar2 != '.') goto LAB_0011f5c8;
      uVar11 = 1;
      iVar5 = -1;
      goto LAB_0011f495;
    }
    dVar14 = dVar14 * 10.0 + (double)(int)(uVar3 - 0x30);
    iVar5 = iVar5 + 1;
  }
  if ((int)pcVar1 == (int)pcVar10) goto LAB_0011f5d2;
  goto LAB_0011f5c8;
LAB_0011f495:
  pcVar10 = pcVar9 + uVar11;
  if (pcVar10 == pcVar1) goto LAB_0011f5c8;
  uVar3 = (uint)*pcVar10;
  if (9 < uVar3 - 0x30) goto LAB_0011f518;
  if (uVar11 < 8) {
    dVar12 = *(double *)(tryParseDouble(char_const*,char_const*,double*)::pow_lut + uVar11 * 8);
  }
  else {
    dVar12 = pow(10.0,(double)iVar5);
  }
  dVar14 = dVar14 + (double)(int)(uVar3 - 0x30) * dVar12;
  uVar11 = uVar11 + 1;
  iVar5 = iVar5 + -1;
  goto LAB_0011f495;
LAB_0011f518:
  if ((uVar3 & 0xff | 0x20) == 0x65) {
    pcVar9 = pcVar10 + 1;
    cVar2 = pcVar10[1];
    if ((pcVar9 == pcVar1) || ((cVar2 != '-' && (cVar2 != '+')))) {
      if (9 < (int)cVar2 - 0x30U) goto LAB_0011f5d2;
      iVar5 = 1;
    }
    else {
      pcVar9 = pcVar10 + 2;
      iVar5 = (uint)(cVar2 == '+') * 2 + -1;
    }
    iVar6 = (int)pcVar1 - (int)pcVar9;
    iVar8 = 0;
    for (lVar7 = 0; pcVar9 + lVar7 != pcVar1; lVar7 = lVar7 + 1) {
      uVar3 = (int)pcVar9[lVar7] - 0x30;
      if (9 < uVar3) {
        iVar6 = (int)lVar7;
        break;
      }
      iVar8 = uVar3 + iVar8 * 10;
    }
    if (iVar6 == 0) goto LAB_0011f5d2;
    if (iVar8 != 0) {
      dVar12 = pow(5.0,(double)(iVar8 * iVar5));
      dVar14 = ldexp(dVar12 * dVar14,iVar8 * iVar5);
    }
  }
LAB_0011f5c8:
  local_38 = dVar13 * dVar14;
LAB_0011f5d2:
  *token = pcVar1;
  return (float)local_38;
}

Assistant:

static inline real_t parseReal(const char **token, double default_value = 0.0) {
  (*token) += strspn((*token), " \t");
  const char *end = (*token) + strcspn((*token), " \t\r");
  double val = default_value;
  tryParseDouble((*token), end, &val);
  real_t f = static_cast<real_t>(val);
  (*token) = end;
  return f;
}